

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool set_config_dic_dir(OpenJTalk *oj,char *path_original)

{
  _Bool _Var1;
  size_t sVar2;
  char *in_RSI;
  long in_RDI;
  char full2 [260];
  char full [260];
  char temp [260];
  char path [260];
  Open_JTalk *in_stack_fffffffffffffb98;
  char *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffcb8;
  char *in_stack_fffffffffffffda8;
  char local_238 [128];
  char *in_stack_fffffffffffffe48;
  char local_128 [272];
  char *local_18;
  long local_10;
  _Bool local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (g_verbose) {
    console_message((char *)0x195dbf);
  }
  clear_path_string(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
  strcpy(local_128,local_18);
  if (local_10 == 0) {
    local_1 = false;
  }
  else {
    sVar2 = strlen(local_128);
    if (sVar2 == 0) {
      local_1 = false;
    }
    else {
      clear_path_string(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
      _Var1 = is_relative(in_stack_fffffffffffffda8);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_string(in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
        }
        sVar2 = strlen(g_ini_dir);
        if (sVar2 == 0) {
          return false;
        }
        sVar2 = strlen(g_ini_dir);
        in_stack_fffffffffffffba0 = (char *)(sVar2 + 1);
        sVar2 = strlen(local_128);
        if ((char *)0x104 < in_stack_fffffffffffffba0 + sVar2 + 1) {
          return false;
        }
        strcpy(local_238,g_ini_dir);
        strcat(local_238,G_SLASH_CHAR);
        strcat(local_238,local_128);
      }
      else {
        if ((g_verbose & 1U) != 0) {
          console_message_string(in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
        }
        strcpy(local_238,local_128);
      }
      _Var1 = exists_dir(in_stack_fffffffffffffe48);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_string(in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
        }
        clear_path_string(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
        clear_path_string(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
        get_fullpath((char *)in_stack_fffffffffffffb98,(char *)0x195fd8);
        if ((g_verbose & 1U) != 0) {
          console_message_string(in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
        }
        _Var1 = check_dic_utf_8(in_stack_fffffffffffffcb8);
        if (_Var1) {
          if ((g_verbose & 1U) != 0) {
            console_message_string(in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
          }
          strcpy((char *)(local_10 + 8),&stack0xfffffffffffffcb8);
          Open_JTalk_load_dic(in_stack_fffffffffffffb98,(char *)0x196070);
          local_1 = true;
        }
        else {
          console_message((char *)0x196015);
          local_1 = false;
        }
      }
      else {
        if ((g_verbose & 1U) != 0) {
          console_message_string(in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
        }
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool set_config_dic_dir(OpenJTalk *oj, const char *path_original)
{
	if (g_verbose)
	{
		console_message(u8"設定ファイルの情報から辞書ディレクトリを決定\n");
	}

	char path[MAX_PATH];
	clear_path_string(path, MAX_PATH);
#if defined(_WIN32)
	normalize_back_slash(path_original, path);
#else
	strcpy(path, path_original);
#endif

	if (!oj)
	{
		return false;
	}

	if (path != NULL && strlen(path) == 0)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	if (is_relative(path))
	{
		if (g_verbose)
		{
			console_message_string(u8"設定ファイルの辞書ディレクトリ指定は相対指定です。: %s\n", path);
		}

		if (g_ini_dir == NULL || strlen(g_ini_dir) == 0)
		{
			return false;
		}

		if (strlen(g_ini_dir) + 1 + strlen(path) + 1 > MAX_PATH)
		{
			return false;
		}

		strcpy(temp, g_ini_dir);
		strcat(temp, G_SLASH_CHAR);
		strcat(temp, path);
	}
	else
	{
		if (g_verbose)
		{
			console_message_string(u8"設定ファイルの辞書ディレクトリ指定は相対指定ではありません。: %s\n", path);
		}
		strcpy(temp, path);
	}

	if (!exists_dir(temp))
	{
		if (g_verbose)
		{
			console_message_string(u8"設定ファイルで指定された辞書ディレクトリは存在しません。:  %s\n", path);
		}
		return false;
	}
	else
	{
		if (g_verbose)
		{
			console_message_string(u8"設定ファイルで指定された辞書ディレクトリは実在します。: %s\n", path);
		}
	}

	char full[MAX_PATH];
	char full2[MAX_PATH];
	clear_path_string(full, MAX_PATH);
	clear_path_string(full2, MAX_PATH);
	get_fullpath(temp, full);
	if (g_verbose)
	{
		console_message_string(u8"辞書ディレクトリのフルパス: %s\n", full);
	}

	if (!check_dic_utf_8(full))
	{
		console_message(u8"辞書ファイルの設定に失敗しました。\n");
		return false;
	}

#if defined(_WIN32)
#else
#endif
	if (g_verbose)
	{
		console_message_string(u8"辞書ディレクトリのフルパス： %s\n", full);
	}
	strcpy(oj->dn_dic_path, full);
#if defined(_WIN32)
	char temp2[MAX_PATH];
	clear_path_string(temp2, MAX_PATH);
	u8tosjis_path(full, temp2);
	Open_JTalk_load_dic(oj->open_jtalk, temp2);
#else
	Open_JTalk_load_dic(oj->open_jtalk, full);
#endif
	return true;
}